

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

btMatrixX<float> * __thiscall
btMatrixX<float>::operator*
          (btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this,btMatrixX<float> *other)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float *pfVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  
  btMatrixX(__return_storage_ptr__,this->m_rows,other->m_cols);
  setZero(__return_storage_ptr__);
  uVar1 = __return_storage_ptr__->m_cols;
  uVar4 = (ulong)(uint)__return_storage_ptr__->m_rows;
  if (__return_storage_ptr__->m_rows < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  iVar8 = __return_storage_ptr__->m_setElemOperations;
  lVar9 = 0;
  for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
    uVar3 = this->m_rows;
    if (this->m_rows < 1) {
      uVar3 = 0;
    }
    pfVar2 = (__return_storage_ptr__->m_storage).m_data;
    lVar11 = 0;
    for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
      pfVar6 = (float *)((long)(other->m_storage).m_data + lVar9);
      fVar14 = 0.0;
      for (uVar10 = 0; uVar3 != uVar10; uVar10 = uVar10 + 1) {
        uVar13 = -(uint)(*pfVar6 != 0.0);
        fVar14 = (float)(~uVar13 & (uint)fVar14 |
                        (uint)(*(float *)((long)(this->m_storage).m_data +
                                         uVar10 * 4 + this->m_cols * lVar11) * *pfVar6 + fVar14) &
                        uVar13);
        pfVar6 = pfVar6 + other->m_cols;
      }
      if ((fVar14 != 0.0) || (NAN(fVar14))) {
        iVar8 = iVar8 + 1;
        __return_storage_ptr__->m_setElemOperations = iVar8;
        pfVar2[uVar7 + uVar12 * (long)(int)uVar1] = fVar14;
      }
      lVar11 = lVar11 + 4;
    }
    lVar9 = lVar9 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX operator*(const btMatrixX& other)
	{
		//btMatrixX*btMatrixX implementation, brute force
		btAssert(cols() == other.rows());

		btMatrixX res(rows(),other.cols());
		res.setZero();
//		BT_PROFILE("btMatrixX mul");
		for (int j=0; j < res.cols(); ++j)
		{
			{
				for (int i=0; i < res.rows(); ++i)
				{
					T dotProd=0;
//					T dotProd2=0;
					//int waste=0,waste2=0;

					{
//						bool useOtherCol = true;
						{
							for (int v=0;v<rows();v++)
							{
								T w = (*this)(i,v);
								if (other(v,j)!=0.f)
								{
									dotProd+=w*other(v,j);	
								}
						
							}
						}
					}
					if (dotProd)
						res.setElem(i,j,dotProd);
				}
			}
		}
		return res;
	}